

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<true>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  undefined1 *puVar1;
  uint32 *this_00;
  EncodedChar *pEVar2;
  SurrogatePairTracker *pSVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  byte bVar7;
  CharBitvec *this_01;
  undefined2 uVar8;
  EncodedChar **ppEVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  OLECHAR OVar13;
  uint uVar14;
  int iVar15;
  codepoint_t codePointValue;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined4 *puVar19;
  long *plVar20;
  Node *pNVar21;
  Node *pNVar22;
  AltNode *pAVar23;
  AltNode *pAVar24;
  Char CVar25;
  ulong uVar26;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar27;
  ArenaAllocator *pAVar28;
  uint32 *puVar29;
  uint uVar30;
  long lVar31;
  uint totalCount;
  uint uVar32;
  EncodedChar EVar33;
  int iVar34;
  MatchSetNode *node;
  Char lc;
  NodeTag *pNVar35;
  AltNode *lastAltNode;
  char16 local_920 [4];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3d0 [8];
  MatchSetNode deferredSetNode;
  CharSet<unsigned_int> codePointSet;
  Char local_5c;
  uint32 *puStack_58;
  codepoint_t upperCharOfRange;
  bool local_4d;
  Char local_4c;
  bool previousWasASurrogate;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_48;
  EncodedChar **local_40;
  EncodedChar local_31;
  
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar19 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                        "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar11) goto LAB_00edf5a5;
    *puVar19 = 0;
  }
  puStack_58 = deferredSetNode.set.rep.full.direct.vec + 6;
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puStack_58);
  deferredSetNode.super_Node._vptr_Node._0_4_ = 0xb;
  deferredSetNode.super_Node._vptr_Node._4_4_ =
       deferredSetNode.super_Node._vptr_Node._4_4_ & 0xffff8000;
  deferredSetNode.super_Node.tag = Empty;
  deferredSetNode.super_Node.features = 0;
  deferredSetNode.super_Node._12_4_ = 0;
  deferredSetNode.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  deferredSetNode.super_Node.followSet._0_4_ = 0;
  deferredSetNode.super_Node._28_8_ = 0xffffffff;
  deferredSetNode.super_Node.prevConsumes.upper = 0xffffffff;
  deferredSetNode.super_Node.thisConsumes.lower = 0;
  lc = 0xffffffff;
  deferredSetNode.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d0 = (undefined1  [8])&PTR_LiteralLength_01558fd0;
  deferredSetNode.super_Node.followConsumes.lower._0_2_ = 0x100;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)&deferredSetNode.isNegation);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01558ef0;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar19 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar11) goto LAB_00edf5a5;
    *puVar19 = 0;
  }
  pEVar2 = this->next;
  local_31 = *pEVar2;
  local_40 = &this->next;
  if (local_31 == '^') {
    if (this->inputLim < pEVar2 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar19 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar11) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**local_40 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                          "!this->IsMultiUnitChar(next[i])");
      if (!bVar11) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    *local_40 = *local_40 + 1;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar19 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar11) goto LAB_00edf5a5;
    *puVar19 = 0;
  }
  pPStack_48 = this;
  EVar33 = **local_40;
  local_4d = false;
  if (EVar33 == ']') {
LAB_00ede009:
    pPVar27 = pPStack_48;
    if (lc != 0xffffffff) {
      CharSet<unsigned_int>::SetRange
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPStack_48->ctAllocator,lc,lc);
    }
    if (pPVar27->unicodeFlagPresent == false) {
      if (deferredSetNode.set.rep._32_8_ - 1 < 5) {
        uVar14 = (int)deferredSetNode.set.rep._32_8_ - 1;
      }
      else if (deferredSetNode.set.rep._32_8_ == 0) {
        uVar14 = CharBitvec::Count((CharBitvec *)&codePointSet);
      }
      else {
        if (((undefined8 *)deferredSetNode.set.rep._32_8_ != &CharSetFull::Instance) &&
           (uVar30 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                               (deferredSetNode.set.rep._32_8_,2), 0xff00 < uVar30)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar19 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                              ,0x252,
                              "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                              ,
                              "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                             );
          if (!bVar11) goto LAB_00edf5a5;
          *puVar19 = 0;
        }
        uVar14 = CharBitvec::Count((CharBitvec *)&codePointSet);
        if ((undefined8 *)deferredSetNode.set.rep._32_8_ == &CharSetFull::Instance) {
          iVar34 = 0xff00;
        }
        else {
          iVar34 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                             (deferredSetNode.set.rep._32_8_,2);
        }
        uVar14 = iVar34 + uVar14;
      }
      local_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
      lVar31 = 0;
      uVar17 = 0;
      do {
        lVar4 = *(long *)((long)codePointSet.characterPlanes + lVar31 + -8);
        if (lVar4 - 1U < 5) {
          uVar18 = (int)lVar4 - 1;
        }
        else {
          plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
          if (plVar20 == (long *)0x0) {
            uVar18 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
          }
          else {
            if ((plVar20 != &CharSetFull::Instance) &&
               (uVar30 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar30)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar9 = local_40;
              *(undefined4 *)local_40 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                  ,0x252,
                                  "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                  ,
                                  "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                 );
              if (!bVar11) goto LAB_00edf5a5;
              *(undefined4 *)ppEVar9 = 0;
            }
            uVar18 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
            plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
            if (plVar20 == &CharSetFull::Instance) {
              iVar34 = 0xff00;
            }
            else {
              iVar34 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
            }
            uVar18 = iVar34 + uVar18;
          }
        }
        pPVar27 = pPStack_48;
        uVar17 = uVar17 + uVar18;
        lVar31 = lVar31 + 0x28;
      } while (lVar31 != 0x2a8);
      if (uVar14 != uVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        ppEVar9 = local_40;
        *(undefined4 *)local_40 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                            "codePointSet.SimpleCharCount() == codePointSet.Count()");
        if (!bVar11) goto LAB_00edf5a5;
        *(undefined4 *)ppEVar9 = 0;
      }
      pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar27->ctAllocator,0x366bee);
      *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
      pNVar21->tag = MatchSet;
      pNVar21->features = 0;
      pNVar21->firstSet = (CharSet<char16_t> *)0x0;
      pNVar21->followSet = (CharSet<char16_t> *)0x0;
      (pNVar21->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar21->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar21->thisConsumes).upper = 0xffffffff;
      (pNVar21->followConsumes).upper = 0xffffffff;
      pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(bool *)&pNVar21[1]._vptr_Node = local_31 == '^';
      *(undefined1 *)((long)&pNVar21[1]._vptr_Node + 1) = 1;
      pNVar35 = &pNVar21[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar35);
      pAVar28 = pPVar27->ctAllocator;
      puVar29 = deferredSetNode.set.rep.full.direct.vec + 6;
    }
    else {
      if (((pPVar27->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar19 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                            "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
        if (!bVar11) goto LAB_00edf5a5;
        *puVar19 = 0;
      }
      if (deferredSetNode.set.rep._32_8_ == 1) {
        plVar20 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
        uVar10 = 0;
        do {
          uVar26 = uVar10;
          if (uVar26 == 0x10) break;
          lVar31 = *plVar20;
          plVar20 = plVar20 + 5;
          uVar10 = uVar26 + 1;
        } while (lVar31 == 1);
        if (0xf < uVar26) {
          pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar27->ctAllocator,0x366bee);
          pNVar21->tag = MatchSet;
          pNVar21->features = 0;
          *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
          pNVar21->firstSet = (CharSet<char16_t> *)0x0;
          pNVar21->followSet = (CharSet<char16_t> *)0x0;
          (pNVar21->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar21->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar21->thisConsumes).upper = 0xffffffff;
          (pNVar21->followConsumes).upper = 0xffffffff;
          pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
          *(undefined2 *)&pNVar21[1]._vptr_Node = 0x100;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar21[1].tag);
          return pNVar21;
        }
      }
      if ((local_31 != '^') && (pPVar27->caseInsensitiveFlagPresent == false)) {
        local_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
        lVar31 = 0;
        iVar34 = 0;
        do {
          lVar4 = *(long *)((long)codePointSet.characterPlanes + lVar31 + -8);
          if (lVar4 - 1U < 5) {
            uVar14 = (int)lVar4 - 1;
          }
          else {
            plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
            if (plVar20 == (long *)0x0) {
              uVar14 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar31));
            }
            else {
              if ((plVar20 != &CharSetFull::Instance) &&
                 (uVar30 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar30)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppEVar9 = local_40;
                *(undefined4 *)local_40 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                    ,0x252,
                                    "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                    ,
                                    "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                   );
                if (!bVar11) goto LAB_00edf5a5;
                *(undefined4 *)ppEVar9 = 0;
              }
              uVar14 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar31));
              plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
              if (plVar20 == &CharSetFull::Instance) {
                iVar15 = 0xff00;
              }
              else {
                iVar15 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
              }
              uVar14 = iVar15 + uVar14;
            }
          }
          iVar34 = iVar34 + uVar14;
          lVar31 = lVar31 + 0x28;
        } while (lVar31 != 0x2a8);
        pPVar27 = pPStack_48;
        if (iVar34 == 1) {
          codePointValue =
               CharSet<unsigned_int>::Singleton
                         ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
          if (codePointValue < 0x10000) {
            pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x48,pPStack_48->ctAllocator,0x366bee);
            pNVar21->tag = MatchChar;
            pNVar21->features = 0;
            *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
            pNVar21->firstSet = (CharSet<char16_t> *)0x0;
            pNVar21->followSet = (CharSet<char16_t> *)0x0;
            (pNVar21->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar21->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar21->thisConsumes).upper = 0xffffffff;
            (pNVar21->followConsumes).upper = 0xffffffff;
            pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
            *(undefined1 *)&pNVar21[1].tag = Empty;
            *(short *)&pNVar21[1]._vptr_Node = (short)codePointValue;
            lVar31 = 0x1d;
            do {
              *(short *)((long)&pNVar21->_vptr_Node + lVar31 * 2) = (short)codePointValue;
              lVar31 = lVar31 + 1;
              pPVar27 = pPStack_48;
            } while (lVar31 != 0x20);
          }
          else {
            if (pPStack_48->unicodeFlagPresent == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar9 = local_40;
              *(undefined4 *)local_40 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                  ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
              if (!bVar11) goto LAB_00edf5a5;
              *(undefined4 *)ppEVar9 = 0;
            }
            Js::NumberUtilities::CodePointAsSurrogatePair
                      (codePointValue,local_920,
                       (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
            pPVar27 = pPStack_48;
            pNVar21 = CreateSurrogatePairAtom
                                (pPStack_48,local_920[0],
                                 negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
          }
          CharSet<unsigned_int>::Clear
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar27->ctAllocator);
          return pNVar21;
        }
      }
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_920);
      if (pPVar27->caseInsensitiveFlagPresent == false) {
        if (local_31 == '^') {
          CharSet<unsigned_int>::ToComplement
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar27->ctAllocator,(CharSet<unsigned_int> *)local_920);
          puStack_58 = (uint32 *)local_920;
        }
        puVar29 = puStack_58;
        if (local_31 == '^') {
          CharSet<unsigned_int>::FreeBody
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar27->ctAllocator);
          puVar29 = puStack_58;
        }
      }
      else {
        puVar29 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar29);
        CharSet<unsigned_int>::ToEquivClass
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   pPVar27->ctAllocator,(CharSet<unsigned_int> *)puVar29);
        local_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
        lVar31 = 0;
        uVar30 = 0;
        do {
          lVar4 = *(long *)((long)&negatedSet.characterPlanes[0x10].rep + lVar31 + 0x20);
          if (lVar4 - 1U < 5) {
            uVar14 = (int)lVar4 - 1;
          }
          else {
            plVar20 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar31 + 0x20);
            if (plVar20 == (long *)0x0) {
              uVar14 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar31));
            }
            else {
              if ((plVar20 != &CharSetFull::Instance) &&
                 (uVar32 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar32)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppEVar9 = local_40;
                *(undefined4 *)local_40 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                    ,0x252,
                                    "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                    ,
                                    "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                   );
                if (!bVar11) goto LAB_00edf5a5;
                *(undefined4 *)ppEVar9 = 0;
              }
              uVar14 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar31));
              plVar20 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar31 + 0x20);
              if (plVar20 == &CharSetFull::Instance) {
                iVar34 = 0xff00;
              }
              else {
                iVar34 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
              }
              uVar14 = iVar34 + uVar14;
            }
          }
          uVar30 = uVar30 + uVar14;
          lVar31 = lVar31 + 0x28;
        } while (lVar31 != 0x2a8);
        lVar31 = 0;
        uVar32 = 0;
        do {
          lVar4 = *(long *)((long)codePointSet.characterPlanes + lVar31 + -8);
          if (lVar4 - 1U < 5) {
            uVar14 = (int)lVar4 - 1;
          }
          else {
            plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
            if (plVar20 == (long *)0x0) {
              uVar14 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar31));
            }
            else {
              if ((plVar20 != &CharSetFull::Instance) &&
                 (uVar16 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar16)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppEVar9 = local_40;
                *(undefined4 *)local_40 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                    ,0x252,
                                    "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                    ,
                                    "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                   );
                if (!bVar11) goto LAB_00edf5a5;
                *(undefined4 *)ppEVar9 = 0;
              }
              uVar14 = CharBitvec::Count((CharBitvec *)
                                         ((long)&codePointSet.characterPlanes[0].rep + lVar31));
              plVar20 = *(long **)((long)codePointSet.characterPlanes + lVar31 + -8);
              if (plVar20 == &CharSetFull::Instance) {
                iVar34 = 0xff00;
              }
              else {
                iVar34 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
              }
              uVar14 = iVar34 + uVar14;
            }
          }
          pPVar27 = pPStack_48;
          uVar32 = uVar32 + uVar14;
          lVar31 = lVar31 + 0x28;
        } while (lVar31 != 0x2a8);
        if (uVar30 < uVar32) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar9 = local_40;
          *(undefined4 *)local_40 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                              "caseEquivalent.Count() >= codePointSet.Count()");
          if (!bVar11) goto LAB_00edf5a5;
          *(undefined4 *)ppEVar9 = 0;
        }
        if (local_31 == '^') {
          puVar29 = deferredSetNode.set.rep.full.direct.vec + 6;
          CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)puVar29,pPVar27->ctAllocator);
          this_00 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
          CharSet<unsigned_int>::ToComplement
                    ((CharSet<unsigned_int> *)this_00,pPVar27->ctAllocator,
                     (CharSet<unsigned_int> *)puVar29);
          CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)this_00,pPVar27->ctAllocator);
        }
        else {
          CharSet<unsigned_int>::CloneFrom
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar27->ctAllocator,
                     (CharSet<unsigned_int> *)
                     (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
          puVar29 = deferredSetNode.set.rep.full.direct.vec + 6;
        }
      }
      local_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
      this_01 = (CharBitvec *)(puVar29 + 2);
      lVar31 = 0;
      uVar14 = 0;
      puStack_58 = puVar29;
      do {
        if (*(long *)((long)puVar29 + lVar31) - 1U < 5) {
          uVar17 = (int)*(long *)((long)puVar29 + lVar31) - 1;
        }
        else {
          plVar20 = *(long **)((long)puVar29 + lVar31);
          if (plVar20 == (long *)0x0) {
            uVar17 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar31));
          }
          else {
            if ((plVar20 != &CharSetFull::Instance) &&
               (uVar30 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar30)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar9 = local_40;
              *(undefined4 *)local_40 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                  ,0x252,
                                  "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                  ,
                                  "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                 );
              if (!bVar11) goto LAB_00edf5a5;
              *(undefined4 *)ppEVar9 = 0;
            }
            uVar17 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar31));
            plVar20 = *(long **)((long)puStack_58 + lVar31);
            if (plVar20 == &CharSetFull::Instance) {
              iVar34 = 0xff00;
            }
            else {
              iVar34 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
            }
            uVar17 = iVar34 + uVar17;
            puVar29 = puStack_58;
          }
        }
        pPVar27 = pPStack_48;
        uVar14 = uVar14 + uVar17;
        lVar31 = lVar31 + 0x28;
      } while (lVar31 != 0x2a8);
      if (*(long *)puVar29 - 1U < 5) {
        uVar17 = (int)*(long *)puVar29 - 1;
      }
      else {
        plVar20 = *(long **)puVar29;
        if (plVar20 == (long *)0x0) {
          uVar17 = CharBitvec::Count(this_01);
        }
        else {
          if ((plVar20 != &CharSetFull::Instance) &&
             (uVar30 = (**(code **)(*plVar20 + 0x58))(plVar20,2), 0xff00 < uVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar9 = local_40;
            *(undefined4 *)local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                ,0x252,
                                "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                ,
                                "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                               );
            if (!bVar11) goto LAB_00edf5a5;
            *(undefined4 *)ppEVar9 = 0;
          }
          uVar17 = CharBitvec::Count(this_01);
          plVar20 = *(long **)puStack_58;
          if (plVar20 == &CharSetFull::Instance) {
            iVar34 = 0xff00;
          }
          else {
            iVar34 = (**(code **)(*plVar20 + 0x58))(plVar20,2);
          }
          uVar17 = iVar34 + uVar17;
          puVar29 = puStack_58;
        }
      }
      if (uVar14 != uVar17) {
        if (uVar17 == 0) {
          pNVar22 = (Node *)0x0;
          pNVar21 = (Node *)0x0;
        }
        else {
          negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
          local_5c = local_5c & 0xffff0000;
          bVar11 = CharSet<char16_t>::GetNextRange
                             ((CharSet<char16_t> *)puStack_58,L'\xd800',
                              (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                              (Char *)&local_5c);
          uVar8 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
          pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar27->ctAllocator,0x366bee);
          pNVar21->tag = MatchSet;
          pNVar21->features = 0;
          *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
          pNVar21->firstSet = (CharSet<char16_t> *)0x0;
          pNVar21->followSet = (CharSet<char16_t> *)0x0;
          (pNVar21->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar21->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar21->thisConsumes).upper = 0xffffffff;
          (pNVar21->followConsumes).upper = 0xffffffff;
          pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
          *(undefined2 *)&pNVar21[1]._vptr_Node = 0x100;
          pNVar35 = &pNVar21[1].tag;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar35);
          puVar29 = puStack_58;
          if ((bVar11) && ((ushort)uVar8 < 0xe000)) {
            CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                      ((CharSet<unsigned_int> *)puStack_58,pPVar27->ctAllocator,
                       (CharSet<char16_t> *)pNVar35);
            pPVar27 = pPStack_48;
            pNVar22 = (Node *)new<Memory::ArenaAllocator>(0x68,pPStack_48->ctAllocator,0x366bee);
            pNVar22->tag = MatchSet;
            pNVar22->features = 0;
            *(uint *)&pNVar22->field_0xc = *(uint *)&pNVar22->field_0xc & 0xffff8000;
            pNVar22->firstSet = (CharSet<char16_t> *)0x0;
            pNVar22->followSet = (CharSet<char16_t> *)0x0;
            (pNVar22->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar22->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar22->thisConsumes).upper = 0xffffffff;
            (pNVar22->followConsumes).upper = 0xffffffff;
            pNVar22->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
            *(undefined2 *)&pNVar22[1]._vptr_Node = 0x100;
            CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar22[1].tag);
            CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                      ((CharSet<unsigned_int> *)puVar29,pPVar27->ctAllocator,
                       (CharSet<char16_t> *)&pNVar22[1].tag);
          }
          else {
            CharSet<unsigned_int>::CloneSimpleCharsTo
                      ((CharSet<unsigned_int> *)puStack_58,pPVar27->ctAllocator,
                       (CharSet<char16_t> *)pNVar35);
            pNVar22 = (Node *)0x0;
            pPVar27 = pPStack_48;
          }
        }
        if (pPVar27->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar9 = local_40;
          *(undefined4 *)local_40 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar11) {
LAB_00edf5a5:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *(undefined4 *)ppEVar9 = 0;
        }
        if (pNVar21 == (Node *)0x0) {
          pAVar23 = (AltNode *)0x0;
        }
        else {
          pAVar23 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar27->ctAllocator,0x366bee);
          (pAVar23->super_Node).tag = Alt;
          (pAVar23->super_Node).features = 0;
          puVar1 = &(pAVar23->super_Node).field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
          (pAVar23->super_Node).firstSet = (CharSet<char16_t> *)0x0;
          (pAVar23->super_Node).followSet = (CharSet<char16_t> *)0x0;
          (pAVar23->super_Node).prevConsumes.lower = 0;
          *(undefined8 *)&(pAVar23->super_Node).prevConsumes.upper = 0xffffffff;
          *(undefined8 *)&(pAVar23->super_Node).thisConsumes.upper = 0xffffffff;
          (pAVar23->super_Node).followConsumes.upper = 0xffffffff;
          (pAVar23->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pAVar23->head = pNVar21;
          pAVar23->switchSize = 0;
          pAVar23->tail = (AltNode *)0x0;
          pAVar23->runtimeTrie = (RuntimeCharTrie *)0x0;
          *(undefined8 *)((long)&pAVar23->runtimeTrie + 5) = 0;
        }
        negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
        local_5c = 0;
        bVar11 = CharSet<unsigned_int>::GetNextRange
                           ((CharSet<unsigned_int> *)puStack_58,0x10000,
                            (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                            &local_5c);
        ppEVar9 = local_40;
        lastAltNode = pAVar23;
        if (bVar11) {
          do {
            if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_5c) {
              pAVar24 = AppendSurrogatePairToDisjunction
                                  (pPStack_48,
                                   negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                   lastAltNode);
            }
            else {
              pAVar24 = AppendSurrogateRangeToDisjunction
                                  (pPStack_48,
                                   negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],local_5c,
                                   lastAltNode);
            }
            if (pAVar23 == (AltNode *)0x0) {
              pAVar23 = pAVar24;
            }
            if (pAVar24 == (AltNode *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)ppEVar9 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                  ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
              if (!bVar11) goto LAB_00edf5a5;
              *(undefined4 *)ppEVar9 = 0;
            }
            do {
              lastAltNode = pAVar24;
              pAVar24 = lastAltNode->tail;
            } while (lastAltNode->tail != (AltNode *)0x0);
            bVar11 = CharSet<unsigned_int>::GetNextRange
                               ((CharSet<unsigned_int> *)puStack_58,local_5c + 1,
                                (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                                &local_5c);
          } while (bVar11);
        }
        pPVar27 = pPStack_48;
        if (pNVar22 != (Node *)0x0) {
          pAVar24 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPStack_48->ctAllocator,0x366bee);
          (pAVar24->super_Node).tag = Alt;
          (pAVar24->super_Node).features = 0;
          puVar1 = &(pAVar24->super_Node).field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
          (pAVar24->super_Node).firstSet = (CharSet<char16_t> *)0x0;
          (pAVar24->super_Node).followSet = (CharSet<char16_t> *)0x0;
          (pAVar24->super_Node).prevConsumes.lower = 0;
          *(undefined8 *)&(pAVar24->super_Node).prevConsumes.upper = 0xffffffff;
          *(undefined8 *)&(pAVar24->super_Node).thisConsumes.upper = 0xffffffff;
          (pAVar24->super_Node).followConsumes.upper = 0xffffffff;
          (pAVar24->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pAVar24->head = pNVar22;
          pAVar24->switchSize = 0;
          pAVar24->tail = (AltNode *)0x0;
          pAVar24->runtimeTrie = (RuntimeCharTrie *)0x0;
          *(undefined8 *)((long)&pAVar24->runtimeTrie + 5) = 0;
          lastAltNode->tail = pAVar24;
        }
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)puStack_58,pPVar27->ctAllocator);
        if (pAVar23 == (AltNode *)0x0) {
          return (Node *)0x0;
        }
        if (pAVar23->tail != (AltNode *)0x0) {
          return &pAVar23->super_Node;
        }
        return pAVar23->head;
      }
      pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar27->ctAllocator,0x366bee);
      *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
      pNVar21->tag = MatchSet;
      pNVar21->features = 0;
      pNVar21->firstSet = (CharSet<char16_t> *)0x0;
      pNVar21->followSet = (CharSet<char16_t> *)0x0;
      (pNVar21->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar21->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar21->thisConsumes).upper = 0xffffffff;
      (pNVar21->followConsumes).upper = 0xffffffff;
      pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(bool *)&pNVar21[1]._vptr_Node = local_31 == '^';
      *(undefined1 *)((long)&pNVar21[1]._vptr_Node + 1) = 1;
      pNVar35 = &pNVar21[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar35);
      pAVar28 = pPVar27->ctAllocator;
    }
    CharSet<unsigned_int>::CloneSimpleCharsTo
              ((CharSet<unsigned_int> *)puVar29,pAVar28,(CharSet<char16_t> *)pNVar35);
    return pNVar21;
  }
  puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_4c = 0xffffffff;
  bVar11 = false;
  bVar6 = false;
LAB_00ede158:
  pPVar27 = pPStack_48;
  if (EVar33 == '\\') {
    if (pPStack_48->inputLim < pPStack_48->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    if ((char)**local_40 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                          "!this->IsMultiUnitChar(next[i])");
      if (!bVar12) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    *local_40 = *local_40 + 1;
  }
  pSVar3 = pPVar27->currentSurrogatePairNode;
  CVar25 = lc;
  if ((pSVar3 == (SurrogatePairTracker *)0x0) || (pSVar3->location != *local_40)) {
    if (EVar33 == '\\') {
      pNVar21 = ClassEscapePass1(pPVar27,(MatchCharNode *)
                                         (codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6
                                         ),(MatchSetNode *)local_3d0,&local_4d);
      if (pNVar21->tag != MatchSet) {
        uVar30 = 0;
        goto LAB_00ede537;
      }
      if (local_4c != 0xffffffff) {
        if (pPVar27->unicodeFlagPresent == true) {
          Fail(pPVar27,-0x7ff5e9d3);
        }
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                   pPVar27->ctAllocator,0x2d,0x2d);
      }
      CharSet<unsigned_int>::UnionInPlace
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPVar27->ctAllocator,(CharSet<char16_t> *)&deferredSetNode.isNegation);
      local_4c = 0xffffffff;
      bVar7 = 1;
      lc = 0xffffffff;
      goto LAB_00ede53d;
    }
    if (EVar33 == '-') {
      if (lc != 0xffffffff && local_4c == 0xffffffff) {
        if (pPVar27->inputLim < pPVar27->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar19 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar12) goto LAB_00edf5a5;
          *puVar19 = 0;
        }
        if ((*local_40)[1] != ']') {
          if (pPVar27->inputLim < *local_40 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar19 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar12) goto LAB_00edf5a5;
            *puVar19 = 0;
          }
          if ((char)**local_40 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar19 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                                "!this->IsMultiUnitChar(next[i])");
            if (!bVar12) goto LAB_00edf5a5;
            *puVar19 = 0;
          }
          *local_40 = *local_40 + 1;
          CVar25 = 0xffffffff;
          bVar7 = 0;
          local_4c = lc;
          goto LAB_00ede53d;
        }
      }
      if (pPVar27->inputLim < pPVar27->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar19 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar12) goto LAB_00edf5a5;
        *puVar19 = 0;
      }
      if ((char)**local_40 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar19 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                            "!this->IsMultiUnitChar(next[i])");
        if (!bVar12) goto LAB_00edf5a5;
        *puVar19 = 0;
      }
      *local_40 = *local_40 + 1;
      uVar30 = 0x2d;
      goto LAB_00ede537;
    }
    if (pPVar27->inputLim <= pPVar27->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar12) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    OVar13 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                       (&pPVar27->super_UTF8EncodingPolicyBase<false>,local_40,pPVar27->inputLim);
    uVar30 = (uint)(ushort)OVar13;
  }
  else {
    uVar30 = pSVar3->value;
    if (pPVar27->inputLim < *local_40 + pSVar3->length) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                          "ECCanConsume(this->currentSurrogatePairNode->length)");
      if (!bVar12) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    uVar32 = pPVar27->currentSurrogatePairNode->length;
    if (pPVar27->inputLim < pPVar27->next + uVar32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar12) goto LAB_00edf5a5;
      *puVar19 = 0;
    }
    pPStack_48->next = pPStack_48->next + uVar32;
    pSVar3 = pPStack_48->currentSurrogatePairNode;
    (pPStack_48->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar3->multiUnits;
    pPStack_48->currentSurrogatePairNode = pSVar3->next;
  }
LAB_00ede537:
  bVar7 = 0;
  lc = uVar30;
LAB_00ede53d:
  pPVar27 = pPStack_48;
  if (!(bool)(~bVar11 & CVar25 == 0xffffffff)) {
    puVar29 = deferredSetNode.set.rep.full.direct.vec + 6;
    if (bVar11) {
      if (pPStack_48->unicodeFlagPresent == true) {
        Fail(pPStack_48,-0x7ff5e9d3);
      }
      pPVar27 = pPStack_48;
      if (lc != 0xffffffff) {
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)puVar29,pPStack_48->ctAllocator,lc,lc);
      }
      pAVar28 = pPVar27->ctAllocator;
      lc = 0x2d;
      CVar25 = 0x2d;
    }
    else {
      if (local_4c == 0xffffffff) {
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)puVar29,pPStack_48->ctAllocator,CVar25,CVar25);
        local_4c = 0xffffffff;
        goto LAB_00ede63e;
      }
      if (lc < local_4c) {
        if (pPStack_48->unicodeFlagPresent == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar19 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
          if (!bVar11) goto LAB_00edf5a5;
          *puVar19 = 0;
        }
        Fail(pPStack_48,-0x7ff5ec63);
      }
      pAVar28 = pPStack_48->ctAllocator;
      pPVar27 = pPStack_48;
      CVar25 = local_4c;
    }
    CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)puVar29,pAVar28,CVar25,lc);
    local_4c = 0xffffffff;
    lc = 0xffffffff;
  }
LAB_00ede63e:
  if (pPVar27->inputLim < pPVar27->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar19 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar11) goto LAB_00edf5a5;
    *puVar19 = 0;
  }
  EVar33 = **local_40;
  bVar11 = bVar6;
  bVar6 = (bool)(bVar7 & EVar33 == '-');
  if (EVar33 == ']') goto LAB_00ede009;
  goto LAB_00ede158;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }